

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

void helicsTranslatorSetString(HelicsTranslator trans,char *prop,char *val,HelicsError *err)

{
  Translator *pTVar1;
  size_t sVar2;
  size_t sVar3;
  
  pTVar1 = getTranslator(trans,err);
  if (pTVar1 != (Translator *)0x0) {
    if (prop == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar2 = strlen(prop);
      sVar3 = strlen(val);
      (*(pTVar1->super_Interface)._vptr_Interface[6])(pTVar1,sVar2,prop,sVar3,val);
    }
  }
  return;
}

Assistant:

void helicsTranslatorSetString(HelicsTranslator trans, const char* prop, const char* val, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(prop, void());
    try {
        translator->setString(prop, val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}